

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

uint8 * google::protobuf::internal::WireFormatLite::WritePrimitiveToArray<float>
                  (int field_number,RepeatedField<float> *value,
                  _func_uint8_ptr_int_float_uint8_ptr *Writer,uint8 *target)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  
  iVar1 = value->current_size_;
  if ((long)iVar1 != 0) {
    pfVar2 = RepeatedField<float>::unsafe_data(value);
    lVar3 = 0;
    do {
      target = (*Writer)(field_number,pfVar2[lVar3],target);
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return target;
}

Assistant:

inline uint8* WireFormatLite::WritePrimitiveToArray(
    int field_number,
    const RepeatedField<T>& value,
    uint8* (*Writer)(int, T, uint8*), uint8* target) {
  const int n = value.size();
  if (n == 0) {
    return target;
  }

  const T* ii = value.unsafe_data();
  int i = 0;
  do {
    target = Writer(field_number, ii[i], target);
  } while (++i < n);

  return target;
}